

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNSwap.cpp
# Opt level: O1

void __thiscall NaPNSwapper::NaPNSwapper(NaPNSwapper *this,char *szNodeName)

{
  NaPetriNode::NaPetriNode(&this->super_NaPetriNode,szNodeName);
  (this->super_NaPetriNode)._vptr_NaPetriNode = (_func_int **)&PTR__NaPNSwapper_00175ad8;
  NaPetriCnInput::NaPetriCnInput(&this->turn,&this->super_NaPetriNode,"turn");
  NaPetriCnInput::NaPetriCnInput(&this->in,&this->super_NaPetriNode,"in");
  NaPetriCnInput::NaPetriCnInput(&this->in2,&this->super_NaPetriNode,"in2");
  NaPetriCnOutput::NaPetriCnOutput(&this->out,&this->super_NaPetriNode,"out");
  NaPetriCnOutput::NaPetriCnOutput(&this->out2,&this->super_NaPetriNode,"out2");
  return;
}

Assistant:

NaPNSwapper::NaPNSwapper (const char* szNodeName)
: NaPetriNode(szNodeName),
  ////////////////
  // Connectors //
  ////////////////
  in(this, "in"),
  in2(this, "in2"),
  out(this, "out"),
  out2(this, "out2"),
  turn(this, "turn")
{
    // Nothing to do
}